

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O2

string * __thiscall
ZXing::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ZXing *this,BitMatrix *matrix,char one,char zero,
          bool addSpace,bool printAsCString)

{
  char cVar1;
  int y;
  uchar *puVar2;
  Range<const_unsigned_char_*> RVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (y = 0; y < *(int *)(this + 4); y = y + 1) {
    cVar1 = (char)__return_storage_ptr__;
    if (addSpace) {
      std::__cxx11::string::push_back(cVar1);
    }
    RVar3 = BitMatrix::row((BitMatrix *)this,y);
    for (puVar2 = RVar3._begin; puVar2 != RVar3._end; puVar2 = puVar2 + 1) {
      std::__cxx11::string::push_back(cVar1);
      if (zero != '\0') {
        std::__cxx11::string::push_back(cVar1);
      }
    }
    if (addSpace) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::push_back(cVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(const BitMatrix& matrix, char one, char zero, bool addSpace, bool printAsCString)
{
	std::string result;
	result.reserve((addSpace ? 2 : 1) * (matrix.width() * matrix.height()) + matrix.height());
	for (int y = 0; y < matrix.height(); ++y) {
		if (printAsCString)
			result += '"';
		for (auto bit : matrix.row(y)) {
			result += bit ? one : zero;
			if (addSpace)
				result += ' ';
		}
		if (printAsCString)
			result += "\\n\"";
		result += '\n';
	}
	return result;
}